

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Textures.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::findOrCreateTexture(SemanticParser *this,SP *in)

{
  bool bVar1;
  __shared_ptr *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  SP SVar2;
  SP *in_stack_00000170;
  SemanticParser *in_stack_00000178;
  mapped_type *in_stack_ffffffffffffff88;
  shared_ptr<pbrt::Texture> *in_stack_ffffffffffffff90;
  element_type *in_stack_ffffffffffffffc8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffd0;
  
  this_00 = (__shared_ptr *)
            std::
            map<std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>,_std::less<std::shared_ptr<pbrt::syntactic::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>_>_>
            ::operator[]((map<std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>,_std::less<std::shared_ptr<pbrt::syntactic::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>_>_>
                          *)in_stack_ffffffffffffffd0._M_pi,(key_type *)in_stack_ffffffffffffffc8);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(this_00);
  if (!bVar1) {
    in_stack_ffffffffffffff90 = (shared_ptr<pbrt::Texture> *)&stack0xffffffffffffffc8;
    std::shared_ptr<pbrt::syntactic::Texture>::shared_ptr
              ((shared_ptr<pbrt::syntactic::Texture> *)in_stack_ffffffffffffff90,
               (shared_ptr<pbrt::syntactic::Texture> *)in_stack_ffffffffffffff88);
    createTextureFrom(in_stack_00000178,in_stack_00000170);
    in_stack_ffffffffffffff88 =
         std::
         map<std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>,_std::less<std::shared_ptr<pbrt::syntactic::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>_>_>
         ::operator[]((map<std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>,_std::less<std::shared_ptr<pbrt::syntactic::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>_>_>
                       *)in_stack_ffffffffffffffd0._M_pi,(key_type *)in_stack_ffffffffffffffc8);
    std::shared_ptr<pbrt::Texture>::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x1b105b);
    std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::Texture> *)0x1b1065);
  }
  std::
  map<std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>,_std::less<std::shared_ptr<pbrt::syntactic::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>_>_>
  ::operator[]((map<std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>,_std::less<std::shared_ptr<pbrt::syntactic::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>_>_>
                *)in_stack_ffffffffffffffd0._M_pi,(key_type *)in_stack_ffffffffffffffc8);
  std::shared_ptr<pbrt::Texture>::shared_ptr(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  SVar2.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar2.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SP)SVar2.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Texture::SP SemanticParser::findOrCreateTexture(pbrt::syntactic::Texture::SP in)
  {
    if (!textureMapping[in]) {
      textureMapping[in] = createTextureFrom(in);
    }
    return textureMapping[in];
  }